

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O3

void FAudio_INTERNAL_FlushPendingBuffers(FAudioSourceVoice *voice)

{
  FAudioBufferEntry *pFVar1;
  FAudioVoiceCallback *pFVar2;
  
  FAudio_PlatformLockMutex((voice->field_19).src.bufferLock);
  while (pFVar1 = (voice->field_19).src.flushList, pFVar1 != (FAudioBufferEntry *)0x0) {
    (voice->field_19).src.flushList = pFVar1->next;
    pFVar2 = (voice->field_19).src.callback;
    if ((pFVar2 != (FAudioVoiceCallback *)0x0) && (pFVar2->OnBufferEnd != (OnBufferEndFunc)0x0)) {
      FAudio_PlatformUnlockMutex(voice->audio->sourceLock);
      pFVar2 = (voice->field_19).src.callback;
      (*pFVar2->OnBufferEnd)(pFVar2,(pFVar1->buffer).pContext);
      FAudio_PlatformLockMutex(voice->audio->sourceLock);
    }
    (*voice->audio->pFree)(pFVar1);
  }
  FAudio_PlatformUnlockMutex((voice->field_19).src.bufferLock);
  return;
}

Assistant:

static void FAudio_INTERNAL_FlushPendingBuffers(FAudioSourceVoice *voice)
{
	FAudioBufferEntry *entry;

	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)

	/* Remove pending flushed buffers and send an event for each one */
	while (voice->src.flushList != NULL)
	{
		entry = voice->src.flushList;
		voice->src.flushList = voice->src.flushList->next;

		if (voice->src.callback != NULL && voice->src.callback->OnBufferEnd != NULL)
		{
			FAudio_PlatformUnlockMutex(voice->audio->sourceLock);
			LOG_MUTEX_UNLOCK(voice->audio, voice->audio->sourceLock)

			voice->src.callback->OnBufferEnd(
				voice->src.callback,
				entry->buffer.pContext
			);

			FAudio_PlatformLockMutex(voice->audio->sourceLock);
			LOG_MUTEX_LOCK(voice->audio, voice->audio->sourceLock)
		}
		voice->audio->pFree(entry);
	}

	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
}